

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::CreateConstantTable(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  WriteBarrierPtr<void> *ptr;
  RootObjectBase *var;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((this->m_constTable).ptr != (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1103,"(this->GetConstTable() == nullptr)",
                                "this->GetConstTable() == nullptr");
    if (!bVar2) goto LAB_006cff86;
    *puVar4 = 0;
  }
  RVar3 = GetConstantCount(this);
  if (RVar3 < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1104,"(GetConstantCount() > FirstRegSlot)",
                                "GetConstantCount() > FirstRegSlot");
    if (!bVar2) goto LAB_006cff86;
    *puVar4 = 0;
  }
  pRVar5 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  RVar3 = GetConstantCount(this);
  data.plusSize = (size_t)RVar3;
  local_48 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x1106;
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_48);
  RVar3 = GetConstantCount(this);
  ptr = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                  ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)RVar3);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet(&this->m_constTable,ptr);
  var = LoadRootObject(this);
  if (var == (RootObjectBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1110,"(false)","false");
    if (!bVar2) {
LAB_006cff86:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    var = (RootObjectBase *)
          (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  RecordConstant(this,1,var);
  return;
}

Assistant:

void FunctionBody::CreateConstantTable()
    {
        Assert(this->GetConstTable() == nullptr);
        Assert(GetConstantCount() > FirstRegSlot);

        this->SetConstTable(RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(), Field(Var), GetConstantCount()));

        // Initialize with the root object, which will always be recorded here.
        Js::RootObjectBase * rootObject = this->LoadRootObject();
        if (rootObject)
        {
            this->RecordConstant(RootObjectRegSlot, rootObject);
        }
        else
        {
            Assert(false);
            this->RecordConstant(RootObjectRegSlot, this->m_scriptContext->GetLibrary()->GetUndefined());
        }

    }